

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O2

int arkRelax(ARKodeMem ark_mem,int *relax_fails,sunrealtype *dsm_inout)

{
  long *plVar1;
  ARKodeRelaxMem pAVar2;
  ARKodeRelaxMem pAVar3;
  N_Vector p_Var4;
  N_Vector p_Var5;
  N_Vector p_Var6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ARKodeRelaxMem pAVar10;
  int iVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  ulong uVar16;
  ulong uVar17;
  sunrealtype *relax_param;
  ulong uVar18;
  double dVar19;
  double dVar20;
  sunrealtype *psVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  sunrealtype sVar28;
  double in_XMM12_Qa;
  sunrealtype sVar29;
  undefined8 in_XMM12_Qb;
  sunrealtype *psVar30;
  ulong uVar31;
  sunrealtype fa;
  sunrealtype local_a0;
  sunrealtype *local_98;
  ulong uStack_90;
  sunrealtype *local_88;
  ulong uStack_80;
  int *local_78;
  sunrealtype *local_70;
  double local_68;
  undefined8 uStack_60;
  sunrealtype local_58;
  ulong uStack_50;
  double *local_40;
  double local_38;
  
  pAVar2 = ark_mem->relax_mem;
  if (pAVar2 == (ARKodeRelaxMem)0x0) {
    arkProcessError(ark_mem,-0x2c,0x364,"arkRelax",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                    ,"Relaxation memory is NULL.");
    return -0x2c;
  }
  iVar8 = (*pAVar2->delta_e_fn)
                    (ark_mem,pAVar2->relax_jac_fn,&pAVar2->num_relax_jac_evals,&pAVar2->delta_e);
  if (iVar8 != 0) goto LAB_00154fc3;
  N_VLinearSum(0x3ff0000000000000,ark_mem->ycur,ark_mem->yn,ark_mem->tempv2);
  iVar8 = (*pAVar2->relax_fn)(ark_mem->yn,&pAVar2->e_old,ark_mem->user_data);
  pAVar2->num_relax_fn_evals = pAVar2->num_relax_fn_evals + 1;
  if (iVar8 < 0) {
    return -0x2d;
  }
  if (iVar8 != 0) goto LAB_00155040;
  pAVar2->relax_param = pAVar2->relax_param_prev;
  local_78 = relax_fails;
  local_40 = dsm_inout;
  if (pAVar2->solver != ARK_RELAX_NEWTON) {
    if (pAVar2->solver != ARK_RELAX_BRENT) {
      return -0x16;
    }
    iVar8 = -1;
    pAVar3 = ark_mem->relax_mem;
    local_98 = (sunrealtype *)((double)pAVar3->relax_param * 1.1);
    iVar11 = 10;
    pAVar10 = pAVar3;
    psVar21 = (sunrealtype *)pAVar3->relax_param;
    uVar31 = 0;
    sVar29 = local_a0;
    do {
      local_a0 = sVar29;
      psVar21 = (sunrealtype *)((double)psVar21 * 0.9);
      bVar12 = iVar11 == 0;
      iVar11 = iVar11 + -1;
      relax_param = local_98;
      uVar16 = uVar31;
      if (bVar12) break;
      local_88 = local_98;
      local_98 = psVar21;
      uStack_90 = uVar31;
      uStack_80 = uVar31;
      iVar9 = arkRelaxResidual((sunrealtype)psVar21,&fa,ark_mem);
      pAVar10 = ark_mem->relax_mem;
      pAVar10->num_relax_fn_evals = pAVar10->num_relax_fn_evals + 1;
      if (iVar9 < 0) goto LAB_001553bd;
      if (iVar9 != 0) goto LAB_00155768;
      in_XMM12_Qb = 0;
      psVar21 = local_98;
      sVar29 = fa;
      if (ABS(fa) < pAVar3->res_tol) goto LAB_00155302;
      relax_param = local_88;
      uVar16 = uStack_80;
      uVar31 = uStack_90;
      in_XMM12_Qa = fa;
      sVar29 = fa;
    } while (0.0 <= fa);
    local_98 = psVar21;
    if (in_XMM12_Qa <= 0.0) {
      iVar11 = 10;
      while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
        uStack_90 = uVar31;
        local_88 = relax_param;
        uStack_80 = uVar16;
        iVar9 = arkRelaxResidual((sunrealtype)relax_param,&local_a0,ark_mem);
        pAVar10 = ark_mem->relax_mem;
        pAVar10->num_relax_fn_evals = pAVar10->num_relax_fn_evals + 1;
        if (iVar9 < 0) goto LAB_001553bd;
        if (iVar9 != 0) goto LAB_00155768;
        in_XMM12_Qb = 0;
        psVar21 = local_88;
        sVar29 = local_a0;
        if (ABS(local_a0) < pAVar3->res_tol) goto LAB_00155302;
        uVar16 = uStack_80;
        if (0.0 < local_a0) {
          in_XMM12_Qb = 0;
          relax_param = local_88;
          uVar31 = uStack_90;
          in_XMM12_Qa = fa;
          goto LAB_00155405;
        }
        relax_param = (sunrealtype *)((double)local_88 * 1.1);
        local_98 = local_88;
        uVar31 = uStack_80;
        in_XMM12_Qa = local_a0;
        fa = local_a0;
      }
      if (0.0 <= local_a0) {
LAB_00155405:
        iVar11 = -0x2d;
        dVar15 = 0.0;
        uVar17 = uVar31;
        dVar13 = 0.0;
        psVar30 = local_98;
        do {
          iVar8 = iVar8 + 1;
          if (pAVar10->max_iters <= iVar8) goto LAB_00155326;
          if (((0.0 < in_XMM12_Qa) && (0.0 < local_a0)) ||
             ((uVar18 = 0, in_XMM12_Qa < 0.0 && (local_a0 < 0.0)))) {
            in_XMM12_Qb = 0;
            dVar15 = (double)relax_param - (double)local_98;
            uVar18 = uVar16;
            dVar13 = dVar15;
            in_XMM12_Qa = fa;
            psVar30 = local_98;
            uVar31 = uVar17;
          }
          psVar21 = relax_param;
          uVar17 = uVar16;
          sVar28 = in_XMM12_Qa;
          if (ABS(in_XMM12_Qa) < ABS(local_a0)) {
            fa = local_a0;
            in_XMM12_Qb = 0;
            psVar21 = psVar30;
            uVar17 = uVar31;
            local_98 = relax_param;
            sVar28 = local_a0;
            psVar30 = relax_param;
            uVar31 = uVar16;
            local_a0 = in_XMM12_Qa;
          }
          dVar14 = ABS((double)psVar21) * pAVar3->rel_tol + pAVar3->abs_tol * 0.5;
          dVar19 = ((double)psVar30 - (double)psVar21) * 0.5;
          dVar20 = ABS(dVar19);
          sVar29 = local_a0;
          if ((dVar20 < dVar14) || (ABS(local_a0) < pAVar3->res_tol)) goto LAB_00155302;
          local_38 = dVar19;
          local_58 = dVar19;
          if ((dVar14 <= ABS(dVar13)) && (ABS(local_a0) < ABS(fa))) {
            dVar22 = local_a0 / fa;
            dVar27 = dVar19 + dVar19;
            if (((double)local_98 != (double)psVar30) ||
               (NAN((double)local_98) || NAN((double)psVar30))) {
              auVar25._8_8_ = local_a0;
              auVar25._0_8_ = fa;
              auVar26._8_8_ = sVar28;
              auVar26._0_8_ = sVar28;
              auVar26 = divpd(auVar25,auVar26);
              dVar24 = auVar26._0_8_;
              dVar23 = auVar26._8_8_ + -1.0;
              dVar27 = (dVar24 - auVar26._8_8_) * dVar27 * dVar24 -
                       ((double)psVar21 - (double)local_98) * dVar23;
              dVar24 = (dVar22 + -1.0) * dVar23 * (dVar24 + -1.0);
            }
            else {
              dVar24 = 1.0 - dVar22;
            }
            dVar27 = dVar27 * dVar22;
            dVar23 = -dVar27;
            dVar22 = dVar27;
            if (dVar27 <= dVar23) {
              dVar22 = dVar23;
            }
            dVar24 = (double)(~-(ulong)(dVar23 < dVar27) & (ulong)dVar24 |
                             (ulong)-dVar24 & -(ulong)(dVar23 < dVar27));
            dVar27 = dVar19 * 3.0 * dVar24 - ABS(dVar14 * dVar24);
            if (ABS(dVar13 * dVar24) <= dVar27) {
              dVar27 = ABS(dVar13 * dVar24);
            }
            if (dVar22 + dVar22 < dVar27) {
              dVar20 = ABS(dVar22 / dVar24);
              local_38 = dVar22 / dVar24;
              local_58 = dVar15;
              uVar31 = uVar18;
            }
          }
          uStack_80 = uVar17;
          if (dVar20 <= dVar14) {
            if (dVar19 <= 0.0) {
              local_88 = (sunrealtype *)((double)psVar21 - dVar14);
            }
            else {
              local_88 = (sunrealtype *)(dVar14 + (double)psVar21);
              uStack_80 = uVar17 & 0x7fffffffffffffff;
            }
          }
          else {
            local_88 = (sunrealtype *)((double)psVar21 + local_38);
          }
          fa = local_a0;
          local_98 = psVar21;
          uStack_90 = uVar17;
          local_70 = psVar30;
          local_68 = sVar28;
          uStack_60 = in_XMM12_Qb;
          uStack_50 = uVar31;
          iVar9 = arkRelaxResidual((sunrealtype)local_88,&local_a0,ark_mem);
          pAVar10 = ark_mem->relax_mem;
          pAVar10->num_relax_fn_evals = pAVar10->num_relax_fn_evals + 1;
          if (iVar9 < 0) goto LAB_0015576b;
          uVar31 = 0;
          relax_param = local_88;
          uVar16 = uStack_80;
          dVar15 = local_38;
          uVar17 = uStack_90;
          dVar13 = local_58;
          in_XMM12_Qa = local_68;
          in_XMM12_Qb = uStack_60;
          psVar30 = local_70;
        } while (iVar9 == 0);
LAB_00155768:
        iVar11 = 1;
        goto LAB_0015576b;
      }
    }
LAB_00155326:
    iVar11 = 3;
    goto LAB_0015576b;
  }
  pAVar3 = ark_mem->relax_mem;
  local_70 = &pAVar3->res;
  local_68 = (double)CONCAT44(local_68._4_4_,3);
  iVar8 = -1;
  do {
    if (ark_mem->relax_mem->max_iters <= iVar8 + 1) goto LAB_00155773;
    iVar11 = arkRelaxResidual(pAVar3->relax_param,local_70,ark_mem);
    if (iVar11 != 0) goto LAB_0015576b;
    if (ABS(pAVar3->res) < pAVar3->res_tol) break;
    local_88 = (sunrealtype *)CONCAT44(local_88._4_4_,iVar8 + 1);
    p_Var4 = ark_mem->tempv2;
    p_Var5 = ark_mem->tempv3;
    p_Var6 = ark_mem->tempv4;
    local_58 = ark_mem->relax_mem->delta_e;
    local_98 = (sunrealtype *)ark_mem->user_data;
    N_VLinearSum(0x3ff0000000000000,pAVar3->relax_param,ark_mem->yn,p_Var4,p_Var5);
    iVar8 = (*ark_mem->relax_mem->relax_jac_fn)(p_Var5,p_Var6,local_98);
    plVar1 = &ark_mem->relax_mem->num_relax_jac_evals;
    *plVar1 = *plVar1 + 1;
    if (iVar8 < 0) {
      uVar7 = 0xffffffd2;
LAB_001553d1:
      local_68 = (double)(ulong)uVar7;
      goto LAB_00155773;
    }
    if (iVar8 != 0) {
      uVar7 = 2;
      goto LAB_001553d1;
    }
    dVar13 = (double)N_VDotProd(p_Var4,p_Var6);
    pAVar3->jac = dVar13 - local_58;
    dVar15 = pAVar3->relax_param;
    dVar13 = pAVar3->res / (dVar13 - local_58);
    pAVar3->relax_param = dVar15 - dVar13;
    pAVar3->nls_iters = pAVar3->nls_iters + 1;
    iVar8 = (int)local_88;
  } while (ABS(dVar15) * pAVar3->rel_tol + pAVar3->abs_tol <= ABS(dVar13));
  goto LAB_00155788;
LAB_001553bd:
  iVar11 = -0x2d;
  goto LAB_0015576b;
LAB_00155302:
  pAVar3->res = sVar29;
  pAVar3->relax_param = (sunrealtype)psVar21;
  iVar11 = 0;
LAB_0015576b:
  local_68 = (double)CONCAT44(local_68._4_4_,iVar11);
  if (iVar11 == 0) {
LAB_00155788:
    local_98 = (sunrealtype *)ark_mem->relax_mem->relax_param;
    if ((pAVar2->lower_bound <= (double)local_98) &&
       ((double)local_98 < pAVar2->upper_bound || (double)local_98 == pAVar2->upper_bound)) {
      pAVar2->relax_param_prev = pAVar2->relax_param;
      ark_mem->h = ark_mem->h * (double)local_98;
      iVar8 = (*pAVar2->get_order_fn)(ark_mem);
      dVar15 = (double)SUNRpowerI(local_98,iVar8);
      *local_40 = dVar15 * *local_40;
      N_VLinearSum(local_98,1.0 - (double)local_98,ark_mem->ycur,ark_mem->yn,ark_mem->ycur);
      return 0;
    }
    pAVar2->bound_fails = pAVar2->bound_fails + 1;
    relax_fails = local_78;
  }
  else {
LAB_00155773:
    pAVar2->nls_fails = pAVar2->nls_fails + 1;
    relax_fails = local_78;
    iVar8 = local_68._0_4_;
LAB_00154fc3:
    if (iVar8 < 0) {
      return iVar8;
    }
  }
LAB_00155040:
  pAVar2->num_fails = pAVar2->num_fails + 1;
  iVar8 = *relax_fails;
  *relax_fails = iVar8 + 1;
  iVar11 = -0x2b;
  if (((iVar8 + 1 != pAVar2->max_fails) && (ark_mem->hmin * 1.000001 < ABS(ark_mem->h))) &&
     (ark_mem->fixedstep == 0)) {
    ark_mem->eta = pAVar2->eta_fail;
    iVar11 = 5;
  }
  return iVar11;
}

Assistant:

int arkRelax(ARKodeMem ark_mem, int* relax_fails, sunrealtype* dsm_inout)
{
  int retval;
  sunrealtype relax_val;
  ARKodeRelaxMem relax_mem = ark_mem->relax_mem;

  /* Get the relaxation memory structure */
  if (!relax_mem)
  {
    arkProcessError(ark_mem, ARK_RELAX_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_RELAX_MEM_NULL);
    return ARK_RELAX_MEM_NULL;
  }

  /* Compute the relaxation parameter */
  retval = arkRelaxSolve(ark_mem, relax_mem, &relax_val);
  if (retval < 0) { return retval; }
  if (retval > 0)
  {
    /* Update failure counts */
    relax_mem->num_fails++;
    (*relax_fails)++;

    /* Check for max fails in a step */
    if (*relax_fails == relax_mem->max_fails) { return ARK_RELAX_FAIL; }

    /* Return with an error if |h| == hmin */
    if (SUNRabs(ark_mem->h) <= ark_mem->hmin * ONEPSM)
    {
      return ARK_RELAX_FAIL;
    }

    /* Return with error if using fixed step sizes */
    if (ark_mem->fixedstep) { return (ARK_RELAX_FAIL); }

    /* Cut step size and try again */
    ark_mem->eta = relax_mem->eta_fail;

    return TRY_AGAIN;
  }

  /* Update step size and error estimate */
  ark_mem->h *= relax_val;
  *dsm_inout *= SUNRpowerI(relax_val, relax_mem->get_order_fn(ark_mem));

  /* Relax solution */
  N_VLinearSum(relax_val, ark_mem->ycur, (ONE - relax_val), ark_mem->yn,
               ark_mem->ycur);

  SUNLogDebug(ARK_LOGGER, "relaxation",
              "relaxation parameter = " SUN_FORMAT_G
              ", relaxed h = " SUN_FORMAT_G ", relaxed error = " SUN_FORMAT_G,
              relax_val, ark_mem->h, *dsm_inout);

  return ARK_SUCCESS;
}